

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O1

void helper_cpuid_x86_64(CPUX86State *env)

{
  void *pvVar1;
  int iVar2;
  list_item *plVar3;
  uintptr_t unaff_retaddr;
  uint32_t edx;
  uint32_t ecx;
  uint32_t ebx;
  uint32_t eax;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  
  iVar2 = 0;
  cpu_svm_check_intercept_param_x86_64(env,0x72,0,unaff_retaddr);
  plVar3 = env->uc->hook[1].head;
  if (plVar3 != (list_item *)0x0) {
    do {
      pvVar1 = plVar3->data;
      if (pvVar1 == (void *)0x0) break;
      if (*(char *)((long)pvVar1 + 0x14) == '\0') {
        if (((*(ulong *)((long)pvVar1 + 0x18) <= env->eip) &&
            (env->eip <= *(ulong *)((long)pvVar1 + 0x20))) ||
           (*(ulong *)((long)pvVar1 + 0x20) < *(ulong *)((long)pvVar1 + 0x18))) {
          if (*(int *)((long)pvVar1 + 4) == 0x71) {
            iVar2 = (**(code **)((long)pvVar1 + 0x28))(env->uc,*(undefined8 *)((long)pvVar1 + 0x30))
            ;
          }
          if (env->uc->stop_request != false) break;
        }
      }
      plVar3 = plVar3->next;
    } while (plVar3 != (list_item *)0x0);
    if (iVar2 != 0) {
      return;
    }
  }
  cpu_x86_cpuid_x86_64
            (env,(uint32_t)env->regs[0],(uint32_t)env->regs[1],&local_2c,&local_30,&local_34,
             &local_38);
  env->regs[0] = (ulong)local_2c;
  env->regs[3] = (ulong)local_30;
  env->regs[1] = (ulong)local_34;
  env->regs[2] = (ulong)local_38;
  return;
}

Assistant:

void helper_cpuid(CPUX86State *env)
{
    uint32_t eax, ebx, ecx, edx;
    struct hook *hook;
    int skip_cpuid = 0;

    cpu_svm_check_intercept_param(env, SVM_EXIT_CPUID, 0, GETPC());

    // Unicorn: call registered CPUID hooks
    HOOK_FOREACH_VAR_DECLARE;
    HOOK_FOREACH(env->uc, hook, UC_HOOK_INSN) {
        if (hook->to_delete)
            continue;
        if (!HOOK_BOUND_CHECK(hook, env->eip))
            continue;
        
        // Multiple cpuid callbacks returning different values is undefined.
        // true -> skip the cpuid instruction
        if (hook->insn == UC_X86_INS_CPUID)
            skip_cpuid = ((uc_cb_insn_cpuid_t)hook->callback)(env->uc, hook->user_data);

        // the last callback may already asked to stop emulation
        if (env->uc->stop_request)
            break;
    }

    if (!skip_cpuid) {
        cpu_x86_cpuid(env, (uint32_t)env->regs[R_EAX], (uint32_t)env->regs[R_ECX],
                    &eax, &ebx, &ecx, &edx);
        env->regs[R_EAX] = eax;
        env->regs[R_EBX] = ebx;
        env->regs[R_ECX] = ecx;
        env->regs[R_EDX] = edx;
    }
    
}